

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void BenchTopKSubset<4u>(string *PATH)

{
  Abstract<4U> *this;
  int HIT;
  pointer ppbVar1;
  ostream *poVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  WavingSketch<8U,_1U,_4U> *this_00;
  SS<4U> *this_01;
  USS<4U> *this_02;
  Count_Heap<4U> *this_03;
  LdSketchWrapper<4U> *this_04;
  ofstream *poVar5;
  allocator *paVar6;
  uint32_t i;
  uint32_t _SIZE;
  int l;
  long lVar7;
  pointer ppbVar8;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  int j;
  uint uVar9;
  long lVar10;
  Data<4U> *pDVar11;
  count_type cnt;
  int local_25c;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  LdSketchWrapper<4U> *local_220;
  Data<4U> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  long local_1d0;
  string file;
  HashMap<4U> mp;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_170;
  Abstract<4U> *sketches [5] [5];
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchTopKSubset\n\x1b[0m");
  cnt = 0;
  paVar6 = (allocator *)sketches;
  std::__cxx11::string::string((string *)&file,"caida",paVar6);
  local_218 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
  poVar2 = std::operator<<((ostream *)&std::cout,"Total ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,cnt);
  poVar2 = std::operator<<(poVar2," items");
  std::endl<char,std::char_traits<char>>(poVar2);
  mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
  mp._M_h._M_bucket_count = 1;
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mp._M_h._M_element_count = 0;
  mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mp._M_h._M_rehash_policy._M_next_resize = 0;
  mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pDVar11 = local_218;
  for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
    iVar3 = std::
            _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&mp._M_h,pDVar11);
    if (iVar3.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
        (__node_type *)0x0) {
      pmVar4 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&mp._M_h,pDVar11);
      *pmVar4 = 1;
    }
    else {
      pmVar4 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&mp._M_h,pDVar11);
      *pmVar4 = *pmVar4 + 1;
    }
    pDVar11 = pDVar11 + 1;
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_170,&mp._M_h);
  local_25c = Get_TopK<4u>((HashMap<4U> *)&local_170,2000);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_170);
  _SIZE = 500;
  uVar9 = 30000;
  for (lVar7 = 0x20; lVar7 != 0xe8; lVar7 = lVar7 + 0x28) {
    this_00 = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
    WavingSketch<8U,_1U,_4U>::WavingSketch(this_00,(uVar9 + 20000) / 0x42);
    *(WavingSketch<8U,_1U,_4U> **)((long)sketches[-1] + lVar7 + 8) = this_00;
    this_01 = (SS<4U> *)operator_new(0x78);
    SS<4U>::SS(this_01,_SIZE);
    *(SS<4U> **)((long)sketches[-1] + lVar7 + 0x10) = this_01;
    this_02 = (USS<4U> *)operator_new(0x78);
    USS<4U>::USS(this_02,_SIZE);
    *(USS<4U> **)((long)sketches[-1] + lVar7 + 0x18) = this_02;
    this_03 = (Count_Heap<4U> *)operator_new(0x88);
    Count_Heap<4U>::Count_Heap(this_03,0x9c4,uVar9 / 0xc,3);
    *(Count_Heap<4U> **)((long)sketches[-1] + lVar7 + 0x20) = this_03;
    this_04 = (LdSketchWrapper<4U> *)operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper(this_04,uVar9 + 20000,local_25c);
    *(LdSketchWrapper<4U> **)((long)sketches[0] + lVar7) = this_04;
    _SIZE = _SIZE + 500;
    uVar9 = uVar9 + 50000;
  }
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&outs,4,(allocator_type *)&local_240);
  poVar5 = (ofstream *)operator_new(0x200);
  std::operator+(&local_210,&RESULT_FOLDER_abi_cxx11_,"TopKSubset_");
  std::operator+(&local_1f0,&local_210,&file);
  std::operator+(&local_240,&local_1f0,"_ARE.csv");
  std::ofstream::ofstream(poVar5,(string *)&local_240,_S_out);
  *outs.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar5;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  poVar5 = (ofstream *)operator_new(0x200);
  std::operator+(&local_210,&RESULT_FOLDER_abi_cxx11_,"TopKSubset_");
  std::operator+(&local_1f0,&local_210,&file);
  std::operator+(&local_240,&local_1f0,"_AAE.csv");
  std::ofstream::ofstream(poVar5,(string *)&local_240,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar5;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  poVar5 = (ofstream *)operator_new(0x200);
  std::operator+(&local_210,&RESULT_FOLDER_abi_cxx11_,"TopKSubset_");
  std::operator+(&local_1f0,&local_210,&file);
  std::operator+(&local_240,&local_1f0,"_ARE1.csv");
  std::ofstream::ofstream(poVar5,(string *)&local_240,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar5;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  poVar5 = (ofstream *)operator_new(0x200);
  std::operator+(&local_210,&RESULT_FOLDER_abi_cxx11_,"TopKSubset_");
  std::operator+(&local_1f0,&local_210,&file);
  std::operator+(&local_240,&local_1f0,"_AAE1.csv");
  std::ofstream::ofstream(poVar5,(string *)&local_240,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] =
       (basic_ostream<char,_std::char_traits<char>_> *)poVar5;
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  ppbVar1 = outs.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar8 = outs.
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar8 != ppbVar1;
      ppbVar8 = ppbVar8 + 1) {
    poVar2 = std::operator<<((ostream *)*ppbVar8,"MEM(KB)");
    std::operator<<(poVar2,",");
    for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
      poVar2 = std::operator<<((ostream *)*ppbVar8,(string *)&sketches[0][lVar7]->name);
      std::operator<<(poVar2,",");
    }
    std::endl<char,std::char_traits<char>>((ostream *)*ppbVar8);
  }
  lVar7 = 0;
  while (lVar7 != 5) {
    local_1d0 = lVar7 + 1;
    uVar9 = (int)local_1d0 * 0x32;
    local_220 = (LdSketchWrapper<4U> *)lVar7;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar9);
    ppbVar1 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppbVar8 = outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppbVar8 != ppbVar1;
        ppbVar8 = ppbVar8 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar8,uVar9);
      std::operator<<(poVar2,",");
    }
    local_220 = (LdSketchWrapper<4U> *)sketches[(long)local_220][4];
    LdSketchWrapper<4U>::average_l(local_220);
    printf("Init average l: %lf\n");
    for (lVar7 = 0; lVar7 < cnt; lVar7 = lVar7 + 1) {
      pDVar11 = local_218 + lVar7;
      for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
        (**(code **)**(undefined8 **)(paVar6 + lVar10 * 8))
                  (*(undefined8 **)(paVar6 + lVar10 * 8),pDVar11);
      }
    }
    LdSketchWrapper<4U>::average_l(local_220);
    printf("After average l: %lf\n");
    HIT = local_25c;
    for (lVar7 = 0;
        ppbVar1 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppbVar8 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar7 != 5; lVar7 = lVar7 + 1) {
      this = *(Abstract<4U> **)(paVar6 + lVar7 * 8);
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_68,&mp._M_h);
      Abstract<4U>::CheckSubset(this,(HashMap<4U> *)&local_68,HIT,100,1000,&outs);
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      (*this->_vptr_Abstract[9])(this);
    }
    for (; ppbVar8 != ppbVar1; ppbVar8 = ppbVar8 + 1) {
      std::endl<char,std::char_traits<char>>((ostream *)*ppbVar8);
    }
    paVar6 = paVar6 + 0x28;
    lVar7 = local_1d0;
  }
  operator_delete(local_218,4);
  std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base(&outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 );
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&mp._M_h);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void BenchTopKSubset(std::string PATH)
{
	printf("\033[0m\033[1;4;33m# Testing function: BenchTopKSubset\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 5;
	constexpr int32_t cmp_num = 5;
	constexpr int32_t epoch_num = 100;
	constexpr int32_t batch_size = 1000;
	int heap_size = 2500;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK<DATA_LEN>(mp, 2000);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new SS<DATA_LEN>(memory / 100);
		sketches[i][2] = new USS<DATA_LEN>(memory / 100);
		sketches[i][3] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][4] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE.csv"); // subset sum
	outs[1] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_ARE1.csv"); //subset average
	outs[3] = new std::ofstream(RESULT_FOLDER + "TopKSubset_" + file + "_AAE1.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][4])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->CheckSubset(mp, topK, epoch_num, batch_size, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}